

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void jsonAppendPathName(JsonEachCursor *p)

{
  byte *pbVar1;
  u32 i;
  u32 uVar2;
  byte *pbVar3;
  ulong uVar4;
  char *zFormat;
  ulong uVar5;
  int N;
  long in_FS_OFFSET;
  u32 sz;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (p->eType == '\v') {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      jsonPrintf(0x1e,&p->path,"[%lld]");
      return;
    }
  }
  else {
    sz = 0;
    i = p->i;
    uVar2 = jsonbPayloadSize(&p->sParse,i,&sz);
    pbVar3 = (p->sParse).aBlob + (uVar2 + i);
    uVar4 = (ulong)sz;
    if ((uVar4 != 0) && ((""[*pbVar3] & 2) != 0)) {
      uVar5 = 0;
      do {
        if (uVar4 == uVar5) {
          if (*(long *)(in_FS_OFFSET + 0x28) != local_20) goto LAB_001e049e;
          N = sz + 2;
          zFormat = ".%.*s";
          goto LAB_001e0469;
        }
        pbVar1 = pbVar3 + uVar5;
        uVar5 = uVar5 + 1;
      } while ((""[*pbVar1] & 6) != 0);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      N = sz + 4;
      zFormat = ".\"%.*s\"";
LAB_001e0469:
      jsonPrintf(N,&p->path,zFormat,uVar4,pbVar3);
      return;
    }
  }
LAB_001e049e:
  __stack_chk_fail();
}

Assistant:

static void jsonAppendPathName(JsonEachCursor *p){
  assert( p->nParent>0 );
  assert( p->eType==JSONB_ARRAY || p->eType==JSONB_OBJECT );
  if( p->eType==JSONB_ARRAY ){
    jsonPrintf(30, &p->path, "[%lld]", p->aParent[p->nParent-1].iKey);
  }else{
    u32 n, sz = 0, k, i;
    const char *z;
    int needQuote = 0;
    n = jsonbPayloadSize(&p->sParse, p->i, &sz);
    k = p->i + n;
    z = (const char*)&p->sParse.aBlob[k];
    if( sz==0 || !sqlite3Isalpha(z[0]) ){
      needQuote = 1;
    }else{
      for(i=0; i<sz; i++){
        if( !sqlite3Isalnum(z[i]) ){
          needQuote = 1;
          break;
        }
      }
    }
    if( needQuote ){
      jsonPrintf(sz+4,&p->path,".\"%.*s\"", sz, z);
    }else{
      jsonPrintf(sz+2,&p->path,".%.*s", sz, z);
    }
  }
}